

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkWsiUtil.cpp
# Opt level: O3

vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> *
vk::wsi::getSwapchainImages
          (vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
           *__return_storage_ptr__,DeviceInterface *vkd,VkDevice device,VkSwapchainKHR swapchain)

{
  VkResult VVar1;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> *images;
  deUint32 numImages;
  allocator_type local_2d;
  uint local_2c;
  
  local_2c = 0;
  VVar1 = (*vkd->_vptr_DeviceInterface[0x7a])(vkd,device,swapchain.m_internal,&local_2c,0);
  checkResult(VVar1,"vkd.getSwapchainImagesKHR(device, swapchain, &numImages, DE_NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkWsiUtil.cpp"
              ,0x13f);
  if ((ulong)local_2c == 0) {
    (__return_storage_ptr__->
    super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
    vector(__return_storage_ptr__,(ulong)local_2c,&local_2d);
    VVar1 = (*vkd->_vptr_DeviceInterface[0x7a])
                      (vkd,device,swapchain.m_internal,&local_2c,
                       (__return_storage_ptr__->
                       super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    checkResult(VVar1,"vkd.getSwapchainImagesKHR(device, swapchain, &numImages, &images[0])",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkWsiUtil.cpp"
                ,0x145);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VkImage> getSwapchainImages (const DeviceInterface&			vkd,
										 VkDevice						device,
										 VkSwapchainKHR					swapchain)
{
	deUint32	numImages	= 0;

	VK_CHECK(vkd.getSwapchainImagesKHR(device, swapchain, &numImages, DE_NULL));

	if (numImages > 0)
	{
		std::vector<VkImage>	images	(numImages);

		VK_CHECK(vkd.getSwapchainImagesKHR(device, swapchain, &numImages, &images[0]));

		return images;
	}
	else
		return std::vector<VkImage>();
}